

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<std::complex<long_double>_>::MultiplyByScalar
          (TPZMatrix<std::complex<long_double>_> *this,complex<long_double> alpha,
          TPZMatrix<std::complex<long_double>_> *res)

{
  TPZFMatrixRef<std::complex<long_double>_> local_a8;
  
  (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(res,this);
  Storage(&local_a8,res);
  TPZFMatrix<std::complex<long_double>_>::operator*=
            (&local_a8.super_TPZFMatrix<std::complex<long_double>_>,alpha);
  TPZFMatrixRef<std::complex<long_double>_>::~TPZFMatrixRef(&local_a8);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultiplyByScalar(const TVar alpha, TPZMatrix<TVar>&res) const
{
  res.CopyFrom(this);
  res.Storage() *= alpha;
}